

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall fasttext::QuantMatrix::quantize(QuantMatrix *this,DenseMatrix *mat)

{
  real *x;
  pointer codes;
  Vector *in_RDI;
  real *dataptr;
  Vector norms;
  real *in_stack_000000d0;
  int32_t in_stack_000000dc;
  ProductQuantizer *in_stack_000000e0;
  int32_t in_stack_ffffffffffffff9c;
  int64_t in_stack_ffffffffffffffa0;
  Matrix *in_stack_ffffffffffffffa8;
  ProductQuantizer *in_stack_ffffffffffffffb0;
  QuantMatrix *in_stack_ffffffffffffffc0;
  Vector *in_stack_ffffffffffffffc8;
  DenseMatrix *in_stack_ffffffffffffffd0;
  
  if (((ulong)in_RDI[3].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    Matrix::size(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffb0 = (ProductQuantizer *)&stack0xffffffffffffffd8;
    Vector::Vector((Vector *)in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8);
    DenseMatrix::l2NormRow
              ((DenseMatrix *)in_stack_ffffffffffffffb0,(Vector *)in_stack_ffffffffffffffa8);
    DenseMatrix::divideRow
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (int64_t)in_stack_ffffffffffffffc0,(int64_t)in_RDI);
    quantizeNorm(in_stack_ffffffffffffffc0,in_RDI);
    Vector::~Vector((Vector *)0x1d366a);
  }
  x = DenseMatrix::data((DenseMatrix *)0x1d3693);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
              *)0x1d36a6);
  ProductQuantizer::train(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
  codes = std::
          unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
          operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                      *)0x1d36cc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d36e9);
  ProductQuantizer::compute_codes
            (in_stack_ffffffffffffffb0,x,(uint8_t *)codes,in_stack_ffffffffffffff9c);
  return;
}

Assistant:

void QuantMatrix::quantize(DenseMatrix&& mat) {
  if (qnorm_) {
    Vector norms(mat.size(0));
    mat.l2NormRow(norms);
    mat.divideRow(norms);
    quantizeNorm(norms);
  }
  auto dataptr = mat.data();
  pq_->train(m_, dataptr);
  pq_->compute_codes(dataptr, codes_.data(), m_);
}